

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Sink
          (WindowDistinctAggregatorLocalState *this,DataChunk *sink_chunk,DataChunk *coll_chunk,
          idx_t input_idx,optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  optional_ptr<duckdb::LocalSortState,_true> *this_00;
  DataChunk *this_01;
  DataChunk *this_02;
  data_ptr_t pdVar1;
  WindowAggregator *pWVar2;
  reference other;
  reference pvVar3;
  const_reference pvVar4;
  reference other_00;
  SelectionVector *pSVar5;
  optional_ptr<duckdb::LocalSortState,_true> oVar6;
  LocalSortState *pLVar7;
  idx_t iVar8;
  type global_sort_state;
  long lVar9;
  column_t c;
  ulong __n;
  optional_ptr<duckdb::SelectionVector,_true> filter_sel_local;
  
  iVar8 = sink_chunk->count;
  this_01 = &this->payload_chunk;
  filter_sel_local = filter_sel;
  DataChunk::Reset(this_01);
  other = vector<duckdb::Vector,_true>::get<true>(&this_01->data,0);
  pdVar1 = other->data;
  for (lVar9 = 0; iVar8 << 3 != lVar9; lVar9 = lVar9 + 8) {
    *(idx_t *)(pdVar1 + lVar9) = input_idx;
    input_idx = input_idx + 1;
  }
  pWVar2 = (this->gastate->super_WindowAggregatorGlobalState).aggregator;
  this_02 = &this->sort_chunk;
  for (__n = 0; __n < (ulong)((long)(pWVar2->child_idx).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pWVar2->child_idx).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&this_02->data,__n);
    pvVar4 = vector<unsigned_long,_true>::get<true>(&pWVar2->child_idx,__n);
    other_00 = vector<duckdb::Vector,_true>::get<true>(&coll_chunk->data,*pvVar4);
    Vector::Reference(pvVar3,other_00);
  }
  pvVar3 = vector<duckdb::Vector,_true>::back(&this_02->data);
  Vector::Reference(pvVar3,other);
  iVar8 = sink_chunk->count;
  (this->sort_chunk).count = iVar8;
  (this->payload_chunk).count = iVar8;
  if (filter_sel.ptr != (SelectionVector *)0x0) {
    pSVar5 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&filter_sel_local);
    DataChunk::Slice(this_02,pSVar5,filtered);
    pSVar5 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&filter_sel_local);
    DataChunk::Slice(this_01,pSVar5,filtered);
  }
  this_00 = &this->local_sort;
  if ((this->local_sort).ptr == (LocalSortState *)0x0) {
    oVar6 = WindowDistinctAggregatorGlobalState::InitializeLocalSort(this->gastate);
    (this->local_sort).ptr = oVar6.ptr;
  }
  pLVar7 = optional_ptr<duckdb::LocalSortState,_true>::operator->(this_00);
  LocalSortState::SinkChunk(pLVar7,this_02,this_01);
  pLVar7 = optional_ptr<duckdb::LocalSortState,_true>::operator->(this_00);
  iVar8 = LocalSortState::SizeInBytes(pLVar7);
  if (this->gastate->memory_per_thread < iVar8) {
    pLVar7 = optional_ptr<duckdb::LocalSortState,_true>::operator->(this_00);
    global_sort_state =
         unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
         operator*(&this->gastate->global_sort);
    LocalSortState::Sort(pLVar7,global_sort_state,true);
  }
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, idx_t input_idx,
                                              optional_ptr<SelectionVector> filter_sel, idx_t filtered) {
	//	3: 	for i ← 0 to in.size do
	//	4: 		sorted[i] ← (in[i], i)
	const auto count = sink_chunk.size();
	payload_chunk.Reset();
	auto &sorted_vec = payload_chunk.data[0];
	auto sorted = FlatVector::GetData<idx_t>(sorted_vec);
	std::iota(sorted, sorted + count, input_idx);

	// Our arguments are being fully materialised,
	// but we also need them as sort keys.
	auto &child_idx = gastate.aggregator.child_idx;
	for (column_t c = 0; c < child_idx.size(); ++c) {
		sort_chunk.data[c].Reference(coll_chunk.data[child_idx[c]]);
	}
	sort_chunk.data.back().Reference(sorted_vec);
	sort_chunk.SetCardinality(sink_chunk);
	payload_chunk.SetCardinality(sort_chunk);

	//	Apply FILTER clause, if any
	if (filter_sel) {
		sort_chunk.Slice(*filter_sel, filtered);
		payload_chunk.Slice(*filter_sel, filtered);
	}

	if (!local_sort) {
		local_sort = gastate.InitializeLocalSort();
	}

	local_sort->SinkChunk(sort_chunk, payload_chunk);

	if (local_sort->SizeInBytes() > gastate.memory_per_thread) {
		local_sort->Sort(*gastate.global_sort, true);
	}
}